

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

void __thiscall ChatServer::connectionCreated(ChatServer *this,Stream *stream)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  undefined8 uVar3;
  bool bVar4;
  string nick;
  Stream *local_40;
  string local_38;
  
  local_40 = stream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"+ Incoming connection from ",0x1b);
  Dashel::Stream::getTargetName_abi_cxx11_(&local_38,local_40);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  readLine_abi_cxx11_(&local_38,local_40);
  bVar4 = local_38._M_string_length == 0;
  local_38._M_string_length = local_38._M_string_length - 1;
  if (bVar4) {
    uVar3 = std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                       "basic_string::erase");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar3);
  }
  local_38._M_dataplus._M_p[local_38._M_string_length] = '\0';
  pmVar2 = std::
           map<Dashel::Stream_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Dashel::Stream_*>,_std::allocator<std::pair<Dashel::Stream_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->nicks,&local_40);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+ User ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," is connected.",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void connectionCreated(Stream* stream)
	{
		cout << "+ Incoming connection from " << stream->getTargetName() << " (" << stream << ")" << endl;
		string nick = readLine(stream);
		nick.erase(nick.length() - 1);
		nicks[stream] = nick;
		cout << "+ User " << nick << " is connected." << endl;
	}